

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::on_file_priority
          (torrent *this,storage_error *err,vector<download_priority_t,_file_index_t> *prios)

{
  pointer *this_00;
  vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  *pvVar1;
  vector<download_priority_t,_file_index_t> *pvVar2;
  bool bVar3;
  int iVar4;
  alert_manager *paVar5;
  pointer ppVar6;
  value_type *pvVar7;
  container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  local_108;
  int local_ec;
  uchar local_e5;
  int local_e4;
  download_priority_t prio;
  reference ppStack_e0;
  file_index_t index;
  pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>
  *p;
  iterator __end3;
  iterator __begin3;
  map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  *__range3;
  _Base_ptr local_b8;
  _Rb_tree_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  local_b0;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_a4;
  undefined1 local_a0 [4];
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> max_idx;
  vector<download_priority_t,_file_index_t> new_priority;
  bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> local_71;
  int local_70;
  undefined1 local_60 [24];
  string local_48;
  uchar local_21;
  vector<download_priority_t,_file_index_t> *local_20;
  vector<download_priority_t,_file_index_t> *prios_local;
  storage_error *err_local;
  torrent *this_local;
  
  *(undefined2 *)&this->field_0x604 = *(undefined2 *)&this->field_0x604;
  this->field_0x606 = this->field_0x606 & 0xdf;
  local_20 = prios;
  prios_local = (vector<download_priority_t,_file_index_t> *)err;
  err_local = (storage_error *)this;
  bVar3 = ::std::operator!=(&(this->m_file_priority).
                             super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                            ,&prios->
                              super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                           );
  if (bVar3) {
    update_piece_priorities(this,prios);
    container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
    ::operator=(&this->m_file_priority,prios);
    local_21 = ' ';
    set_need_save_resume(this,(resume_data_flags_t)0x20);
    if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1d & 1) != 0) {
      recalc_share_mode(this);
    }
  }
  bVar3 = storage_error::operator_cast_to_bool((storage_error *)prios_local);
  if (bVar3) {
    paVar5 = alerts(this);
    bVar3 = alert_manager::should_post<libtorrent::file_error_alert>(paVar5);
    if (bVar3) {
      paVar5 = alerts(this);
      pvVar2 = prios_local;
      local_60._20_4_ = storage_error::file((storage_error *)prios_local);
      resolve_filename_abi_cxx11_((string *)(local_60 + 0x18),this,(file_index_t)local_60._20_4_);
      pvVar1 = &prios_local->
                super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ;
      get_handle((torrent *)local_60);
      alert_manager::
      emplace_alert<libtorrent::file_error_alert,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&,libtorrent::torrent_handle>
                (paVar5,(error_code *)pvVar2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_60 + 0x18),
                 (operation_t *)
                 ((long)&(pvVar1->
                         super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                         )._M_impl.super__Vector_impl_data._M_end_of_storage + 3),
                 (torrent_handle *)local_60);
      torrent_handle::~torrent_handle((torrent_handle *)local_60);
      ::std::__cxx11::string::~string((string *)(local_60 + 0x18));
    }
    pvVar2 = prios_local;
    local_70 = (int)storage_error::file((storage_error *)prios_local);
    set_error(this,(error_code *)pvVar2,(file_index_t)local_70);
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
    bitfield_flag(&local_71);
    pause(this);
  }
  else {
    paVar5 = alerts(this);
    bVar3 = alert_manager::should_post<libtorrent::file_prio_alert>(paVar5);
    if (bVar3) {
      paVar5 = alerts(this);
      this_00 = &new_priority.
                 super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 .
                 super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      get_handle((torrent *)this_00);
      alert_manager::emplace_alert<libtorrent::file_prio_alert,libtorrent::torrent_handle>
                (paVar5,(torrent_handle *)this_00);
      torrent_handle::~torrent_handle
                ((torrent_handle *)
                 &new_priority.
                  super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                  .
                  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    bVar3 = ::std::
            map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
            ::empty(&this->m_deferred_file_priorities);
    if ((!bVar3) && ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0)) {
      container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
      ::container_wrapper((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                           *)local_a0,&this->m_file_priority);
      local_b8 = (_Base_ptr)
                 ::std::
                 map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                 ::end(&this->m_deferred_file_priorities);
      local_b0 = ::std::
                 prev<std::_Rb_tree_iterator<std::pair<libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>const,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
                           ((_Rb_tree_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             )local_b8,1);
      ppVar6 = ::std::
               _Rb_tree_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               ::operator->(&local_b0);
      local_a4.m_val = (ppVar6->first).m_val;
      __range3._4_4_ =
           container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
           ::end_index((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                        *)local_a0);
      bVar3 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator<=
                        ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                         ((long)&__range3 + 4),&local_a4);
      if (bVar3) {
        iVar4 = strong_typedef::operator_cast_to_int((strong_typedef *)&local_a4);
        container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
        ::resize<int,void>((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
                            *)local_a0,iVar4 + 1,
                           (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *
                           )&default_priority);
      }
      __end3 = ::std::
               map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
               ::begin(&this->m_deferred_file_priorities);
      p = (pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>
           *)::std::
             map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
             ::end(&this->m_deferred_file_priorities);
      while (bVar3 = ::std::operator!=(&__end3,(_Self *)&p), bVar3) {
        ppStack_e0 = ::std::
                     _Rb_tree_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     ::operator*(&__end3);
        local_ec = (ppStack_e0->first).m_val;
        local_e5 = (ppStack_e0->second).m_val;
        local_e4 = local_ec;
        pvVar7 = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                 ::operator[]((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                               *)local_a0,
                              (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)local_ec);
        pvVar7->m_val = local_e5;
        ::std::
        _Rb_tree_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
        ::operator++(&__end3);
      }
      ::std::
      map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
      ::clear(&this->m_deferred_file_priorities);
      container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
      ::container_wrapper(&local_108,
                          (container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                           *)local_a0);
      prioritize_files(this,&local_108);
      container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
      ::~container_wrapper(&local_108);
      container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
      ::~container_wrapper
                ((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                  *)local_a0);
    }
  }
  return;
}

Assistant:

void torrent::on_file_priority(storage_error const& err
		, aux::vector<download_priority_t, file_index_t> prios)
	{
		m_outstanding_file_priority = false;
		COMPLETE_ASYNC("file_priority");

		if (m_file_priority != prios)
		{
			update_piece_priorities(prios);
			m_file_priority = std::move(prios);
			set_need_save_resume(torrent_handle::if_config_changed);
#ifndef TORRENT_DISABLE_SHARE_MODE
			if (m_share_mode)
				recalc_share_mode();
#endif
		}

		if (err)
		{
			// in this case, some file priorities failed to get set
			if (alerts().should_post<file_error_alert>())
				alerts().emplace_alert<file_error_alert>(err.ec
					, resolve_filename(err.file()), err.operation, get_handle());

			set_error(err.ec, err.file());
			pause();
			return;
		}

		if (alerts().should_post<file_prio_alert>())
			alerts().emplace_alert<file_prio_alert>(get_handle());

		if (!m_deferred_file_priorities.empty() && !m_abort)
		{
			auto new_priority = m_file_priority;
			// resize the vector if we have to. The last item in the map has the
			// highest file index.
			auto const max_idx = std::prev(m_deferred_file_priorities.end())->first;
			if (new_priority.end_index() <= max_idx)
			{
				// any unallocated slot is assumed to have the default priority
				new_priority.resize(static_cast<int>(max_idx) + 1, default_priority);
			}
			for (auto const& p : m_deferred_file_priorities)
			{
				file_index_t const index = p.first;
				download_priority_t const prio = p.second;
				new_priority[index] = prio;
			}
			m_deferred_file_priorities.clear();
			prioritize_files(std::move(new_priority));
		}
	}